

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_connect_selection(_glist *x)

{
  int iVar1;
  t_gobj *ptVar2;
  t_object *ptVar3;
  bool local_159;
  t_object *local_158;
  t_object *local_150;
  t_object *local_148;
  int local_140;
  int local_13c;
  int in21;
  int in20;
  int in12;
  int in10;
  int in02;
  int in01;
  int out21;
  int out20;
  int out12;
  int out10;
  int out02;
  int out01;
  t_object *obj1;
  t_object *obj2;
  t_object *obj0;
  int local_f0;
  int in;
  int out;
  int fanout;
  int ninlets;
  int noutlets;
  t_object *obj_1;
  int sinkno;
  int srcno;
  _outconnect *oc;
  t_linetraverser t;
  t_object *obj;
  t_object *objsink;
  t_object *objsrc;
  t_selection *sel;
  t_gobj *c;
  t_gobj *b;
  t_gobj *a;
  _glist *x_local;
  
  sel = (t_selection *)0x0;
  c = (t_gobj *)0x0;
  b = (t_gobj *)0x0;
  if (x->gl_editor == (t_editor *)0x0) {
    local_148 = (t_object *)0x0;
  }
  else {
    local_148 = (t_object *)x->gl_editor->e_selection;
  }
  objsrc = local_148;
  do {
    if (objsrc == (t_object *)0x0) {
      if (b != (t_gobj *)0x0) {
        if (c == (t_gobj *)0x0) {
          t._112_8_ = pd_checkobject(&b->g_pd);
          if ((t_object *)t._112_8_ != (t_object *)0x0) {
            if (((byte)x->gl_editor->field_0x88 >> 5 & 1) == 0) {
              canvas_undo_add(x,UNDO_SEQUENCE_START,"disconnect",(void *)0x0);
              linetraverser_start((t_linetraverser *)&oc,x);
              while (_sinkno = linetraverser_next((t_linetraverser *)&oc),
                    _sinkno != (_outconnect *)0x0) {
                if (((_glist *)t._112_8_ == t.tr_x) || (t._112_8_ == t._16_8_)) {
                  obj_1._4_4_ = glist_getindex(x,(t_gobj *)t.tr_x);
                  obj_1._0_4_ = glist_getindex(x,(t_gobj *)t._16_8_);
                  canvas_disconnect_with_undo
                            (x,(float)obj_1._4_4_,(float)t.tr_ob._4_4_,(float)(int)obj_1,
                             (float)t.tr_inlet._4_4_);
                }
              }
              canvas_undo_add(x,UNDO_SEQUENCE_END,"disconnect",(void *)0x0);
            }
            else {
              ptVar2 = glist_nth(x,x->gl_editor->e_selectline_index1);
              if (ptVar2 == (t_gobj *)0x0) {
                local_150 = (t_object *)0x0;
              }
              else {
                local_150 = pd_checkobject(&ptVar2->g_pd);
              }
              ptVar2 = glist_nth(x,x->gl_editor->e_selectline_index2);
              if (ptVar2 == (t_gobj *)0x0) {
                local_158 = (t_object *)0x0;
              }
              else {
                local_158 = pd_checkobject(&ptVar2->g_pd);
              }
              iVar1 = canconnect(x,local_150,x->gl_editor->e_selectline_outno,(t_object *)t._112_8_,
                                 0);
              if ((iVar1 != 0) &&
                 (iVar1 = canconnect(x,(t_object *)t._112_8_,0,local_158,
                                     x->gl_editor->e_selectline_inno), iVar1 != 0)) {
                canvas_undo_add(x,UNDO_SEQUENCE_START,"reconnect",(void *)0x0);
                tryconnect(x,local_150,x->gl_editor->e_selectline_outno,(t_object *)t._112_8_,0);
                tryconnect(x,(t_object *)t._112_8_,0,local_158,x->gl_editor->e_selectline_inno);
                canvas_clearline(x);
                canvas_undo_add(x,UNDO_SEQUENCE_END,"reconnect",(void *)0x0);
              }
            }
          }
        }
        else if (sel == (t_selection *)0x0) {
          objsink = pd_checkobject(&b->g_pd);
          if ((objsink != (t_object *)0x0) &&
             (ptVar3 = pd_checkobject(&c->g_pd), ptVar3 != (t_object *)0x0)) {
            obj = ptVar3;
            if (ptVar3->te_ypix < objsink->te_ypix) {
              _ninlets = ptVar3;
              obj = objsink;
              objsink = ptVar3;
            }
            if (((objsink != (t_object *)0x0) && (obj != (t_object *)0x0)) &&
               (iVar1 = obj_noutlets(objsink), iVar1 != 0)) {
              fanout = obj_noutlets(objsink);
              out = obj_ninlets(obj);
              local_159 = false;
              if (fanout == 1) {
                iVar1 = obj_issignaloutlet(objsink,0);
                local_159 = iVar1 != 0;
              }
              in = (int)local_159;
              local_f0 = 0;
              obj0._4_4_ = 0;
              while (((iVar1 = tryconnect(x,objsink,local_f0,obj,obj0._4_4_), iVar1 == 0 &&
                      (local_f0 < fanout)) && (obj0._4_4_ < out))) {
                obj0._4_4_ = obj0._4_4_ + 1;
                if (in == 0) {
                  local_f0 = local_f0 + 1;
                }
              }
            }
          }
        }
        else {
          obj2 = pd_checkobject(&b->g_pd);
          if (((((obj2 != (t_object *)0x0) &&
                (obj1 = pd_checkobject(&c->g_pd), obj1 != (t_object *)0x0)) &&
               (_out02 = pd_checkobject((t_pd *)sel), _out02 != (t_object *)0x0)) &&
              ((obj2 != _out02 && (obj1 != _out02)))) && (obj2 != obj1)) {
            iVar1 = canvas_getconns(obj2,&out10,_out02,&in20);
            if (iVar1 != 1) {
              in20 = -1;
              out10 = -1;
            }
            iVar1 = canvas_getconns(obj2,&out12,obj1,&local_13c);
            if (iVar1 != 1) {
              local_13c = -1;
              out12 = -1;
            }
            iVar1 = canvas_getconns(_out02,&out20,obj2,&in10);
            if (iVar1 != 1) {
              in10 = -1;
              out20 = -1;
            }
            iVar1 = canvas_getconns(_out02,&out21,obj1,&local_140);
            if (iVar1 != 1) {
              local_140 = -1;
              out21 = -1;
            }
            iVar1 = canvas_getconns(obj1,&in01,obj2,&in12);
            if (iVar1 != 1) {
              in12 = -1;
              in01 = -1;
            }
            iVar1 = canvas_getconns(obj1,&in02,_out02,&in21);
            if (iVar1 != 1) {
              in21 = -1;
              in02 = -1;
            }
            canvas_undo_add(x,UNDO_SEQUENCE_START,"reconnect",(void *)0x0);
            iVar1 = canvas_try_bypassobj1(x,obj2,in12,out10,_out02,in20,out21,obj1,local_140,in01);
            if (((((iVar1 == 0) &&
                  (iVar1 = canvas_try_bypassobj1
                                     (x,obj2,in10,out12,obj1,local_13c,in02,_out02,in21,out20),
                  iVar1 == 0)) &&
                 ((iVar1 = canvas_try_bypassobj1
                                     (x,_out02,in21,out20,obj2,in10,out12,obj1,local_13c,in02),
                  iVar1 == 0 &&
                  (((iVar1 = canvas_try_bypassobj1
                                       (x,_out02,in20,out21,obj1,local_140,in01,obj2,in12,out10),
                    iVar1 == 0 &&
                    (iVar1 = canvas_try_bypassobj1
                                       (x,obj1,local_140,in01,obj2,in12,out10,_out02,in20,out21),
                    iVar1 == 0)) &&
                   (iVar1 = canvas_try_bypassobj1
                                      (x,obj1,local_13c,in02,_out02,in21,out20,obj2,in10,out12),
                   iVar1 == 0)))))) &&
                ((iVar1 = canvas_try_insert(x,obj2,in12,out10,_out02,in20,out21,obj1,local_140,in01)
                 , iVar1 == 0 &&
                 (iVar1 = canvas_try_insert(x,obj2,in10,out12,obj1,local_13c,in02,_out02,in21,out20)
                 , iVar1 == 0)))) &&
               ((iVar1 = canvas_try_insert(x,_out02,in21,out20,obj2,in10,out12,obj1,local_13c,in02),
                iVar1 == 0 &&
                ((iVar1 = canvas_try_insert(x,_out02,in20,out21,obj1,local_140,in01,obj2,in12,out10)
                 , iVar1 == 0 &&
                 (iVar1 = canvas_try_insert(x,obj1,local_140,in01,obj2,in12,out10,_out02,in20,out21)
                 , iVar1 == 0)))))) {
              canvas_try_insert(x,obj1,local_13c,in02,_out02,in21,out20,obj2,in10,out12);
            }
            canvas_undo_add(x,UNDO_SEQUENCE_END,"reconnect",(void *)0x0);
          }
        }
      }
      return;
    }
    if (b == (t_gobj *)0x0) {
      b = (t_gobj *)(objsrc->te_g).g_pd;
    }
    else if (c == (t_gobj *)0x0) {
      c = (t_gobj *)(objsrc->te_g).g_pd;
    }
    else {
      if (sel != (t_selection *)0x0) {
        return;
      }
      sel = (t_selection *)(objsrc->te_g).g_pd;
    }
    objsrc = (t_object *)(objsrc->te_g).g_next;
  } while( true );
}

Assistant:

static void canvas_connect_selection(t_canvas *x)
{
    t_gobj *a, *b, *c;
    t_selection *sel;
    t_object *objsrc, *objsink;

    a = b = c = NULL;
    sel = x->gl_editor ? x->gl_editor->e_selection : NULL;
    for (; sel; sel = sel->sel_next)
    {
        if (!a)
            a = sel->sel_what;
        else if (!b)
            b = sel->sel_what;
        else if (!c)
            c = sel->sel_what;
        else
            return;
    }

    if(!a)
        return;

    if(!b)
    {
            /* only a single object is selected.
             * if a connection is selected, insert the object
             * if no connection is selected, disconnect the object
             */
        t_object*obj = pd_checkobject(&a->g_pd);
        if(!obj)
            return;
        if(x->gl_editor->e_selectedline)
        {
            b = glist_nth(x, x->gl_editor->e_selectline_index1);
            objsrc = b?pd_checkobject(&b->g_pd):0;
            b = glist_nth(x, x->gl_editor->e_selectline_index2);
            objsink = b?pd_checkobject(&b->g_pd):0;

            if(canconnect(x, objsrc, x->gl_editor->e_selectline_outno, obj, 0)
               && canconnect(x, obj, 0, objsink, x->gl_editor->e_selectline_inno))
            {
                canvas_undo_add(x, UNDO_SEQUENCE_START, "reconnect", 0);
                tryconnect(x, objsrc, x->gl_editor->e_selectline_outno, obj, 0);
                tryconnect(x, obj, 0, objsink, x->gl_editor->e_selectline_inno);
                canvas_clearline(x);
                canvas_undo_add(x, UNDO_SEQUENCE_END, "reconnect", 0);
            }
        }
        else
        {
                /* disconnect the entire object */
            t_linetraverser t;
            t_outconnect *oc;
            canvas_undo_add(x, UNDO_SEQUENCE_START, "disconnect", 0);
            linetraverser_start(&t, x);
            while ((oc = linetraverser_next(&t)))
            {
                if ((obj == t.tr_ob) || (obj == t.tr_ob2))
                {
                    int srcno = glist_getindex(x, &t.tr_ob->ob_g);
                    int sinkno = glist_getindex(x, &t.tr_ob2->ob_g);
                    canvas_disconnect_with_undo(x, srcno, t.tr_outno, sinkno, t.tr_inno);
                }
            }
            canvas_undo_add(x, UNDO_SEQUENCE_END, "disconnect", 0);
        }
            /* need to return since we have touched 'b' */
        return;
    }

    if(!c)
    {
            /* exactly two objects are selected
             * connect them (top to bottom) if they are patchable
             */
        if (!(objsrc = pd_checkobject(&a->g_pd)) ||
            !(objsink = pd_checkobject(&b->g_pd)))
            return;

        if(objsink->te_ypix < objsrc->te_ypix)
        {
            t_object*obj = objsink;
            objsink = objsrc;
            objsrc = obj;
        }
        if (!objsrc || !objsink)
            return;
        if (obj_noutlets(objsrc))
        {
            int noutlets = obj_noutlets(objsrc);
            int ninlets = obj_ninlets(objsink);
            int fanout = (noutlets == 1) && obj_issignaloutlet(objsrc, 0);
            int out = 0, in = 0;
            while(!tryconnect(x, objsrc, out, objsink, in))
            {
                if (noutlets <= out)
                    return;
                if (ninlets <= in )
                    return;
                in++;
                if(!fanout)
                    out++;
            }
        }
        return;
    }

        /* exactly three objects are selected
         * if they are chained up, unconnect the middle object, and connect the source to the sink
         * if only two of them are connected, insert the third
         */
    if ((objsrc = pd_checkobject(&a->g_pd)) &&
        (objsink = pd_checkobject(&b->g_pd)))
    {
        t_object *obj0 = objsrc, *obj2 = objsink;
        t_object *obj1 = pd_checkobject(&c->g_pd);
        int out01, out02, out10, out12, out20, out21;
        int in01, in02, in10, in12, in20, in21;
        if(!obj1
           || (obj0 == obj1)
           || (obj2 == obj1)
           || (obj0 == obj2))
            return;
#define GET1CONN(a, b) \
        if (1 != canvas_getconns(obj##a, &out##a##b, obj##b, &in##b##a)) \
            out##a##b = in##b##a = -1
        GET1CONN(0, 1);
        GET1CONN(0, 2);
        GET1CONN(1, 0);
        GET1CONN(1, 2);
        GET1CONN(2, 0);
        GET1CONN(2, 1);
#define TRYCONNCHANGE(fun, a, b, c)                                      \
        canvas_try_##fun(x, obj##a, in##a##c, out##a##b, obj##b, in##b##a, out##b##c, obj##c, in##c##b, out##c##a)

        canvas_undo_add(x, UNDO_SEQUENCE_START, "reconnect", 0);
        0
            || TRYCONNCHANGE(bypassobj1, 0, 1, 2)
            || TRYCONNCHANGE(bypassobj1, 0, 2, 1)
            || TRYCONNCHANGE(bypassobj1, 1, 0, 2)
            || TRYCONNCHANGE(bypassobj1, 1, 2, 0)
            || TRYCONNCHANGE(bypassobj1, 2, 0, 1)
            || TRYCONNCHANGE(bypassobj1, 2, 1, 0)
            || TRYCONNCHANGE(insert,     0, 1, 2)
            || TRYCONNCHANGE(insert,     0, 2, 1)
            || TRYCONNCHANGE(insert,     1, 0, 2)
            || TRYCONNCHANGE(insert,     1, 2, 0)
            || TRYCONNCHANGE(insert,     2, 0, 1)
            || TRYCONNCHANGE(insert,     2, 1, 0)
            ;
        canvas_undo_add(x, UNDO_SEQUENCE_END, "reconnect", 0);
    }
}